

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
               (string *s,char *fmt,bool *v,bool *args,bool *args_1,bool *args_2,bool *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               optional<pbrt::Bounds2<float>_> *args_9,optional<pbrt::Bounds2<int>_> *args_10)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBP;
  char *pcVar3;
  string *in_RDI;
  bool *in_R8;
  bool *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  optional<pbrt::Bounds2<int>_> *in_stack_00000020;
  string *in_stack_00000028;
  bool *in_stack_00000038;
  bool *in_stack_00000040;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd10;
  char **in_stack_fffffffffffffd18;
  char **in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffd58;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffd60;
  string local_288 [16];
  char *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  string local_260 [4];
  LogLevel in_stack_fffffffffffffda4;
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  undefined4 local_98;
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [16];
  bool *in_stack_ffffffffffffff90;
  bool *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) == 0) {
    if ((local_82 & 1) == 0) {
      if ((bool)local_83) {
        psVar4 = local_80;
        uVar2 = std::__cxx11::string::find((char)psVar4,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)psVar4,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffd28,(bool *)in_stack_fffffffffffffd20);
        std::__cxx11::string::operator+=(in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else if ((local_82 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                   in_stack_fffffffffffffd88);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffd28,(bool *)in_stack_fffffffffffffd20);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd58);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_240);
        std::ostream::operator<<(local_230,(bool)((byte)in_RDX->_M_dataplus & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        std::__cxx11::string::operator+=(in_RDI,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::stringstream::~stringstream(local_240);
      }
    }
    else {
      pcVar3 = "false";
      if (((byte)in_RDX->_M_dataplus & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,
               (optional<pbrt::Bounds2<float>_> *)in_stack_00000018,in_stack_00000020);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_stack_00000028,(char *)in_stack_00000020,in_stack_00000018,
               (bool *)in_stack_00000010,(bool *)in_stack_00000008,in_R9,in_stack_00000038,
               in_stack_00000040,in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffce8,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
    local_98 = 1;
  }
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}